

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O3

Move * ddSymmSiftingUp(DdManager *table,int y,int xLow)

{
  int y_00;
  uint uVar1;
  DdHalfWord x;
  DdSubtable *pDVar2;
  int iVar3;
  DdHalfWord DVar4;
  int iVar5;
  DdHalfWord DVar6;
  int iVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  long lVar11;
  Move *pMVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  int local_58;
  DdNode *local_40;
  int local_34;
  
  local_40 = (DdNode *)0x0;
  y_00 = table->invperm[y];
  uVar1 = y;
  do {
    uVar13 = uVar1;
    uVar1 = table->subtables[(int)uVar13].next;
  } while (uVar13 < uVar1);
  iVar14 = table->keys - table->isolated;
  local_58 = iVar14;
  if (xLow < (int)uVar13) {
    lVar11 = (long)xLow;
    lVar15 = lVar11 * 0xe + 0x12;
    do {
      iVar5 = table->invperm[lVar11 + 1];
      if ((iVar5 == y_00) || (iVar3 = cuddTestInteract(table,iVar5,y_00), iVar3 != 0)) {
        local_58 = (local_58 + (uint)(table->vars[iVar5]->ref == 1)) -
                   *(int *)((long)&table->subtables->nodelist + lVar15 * 4);
      }
      lVar11 = lVar11 + 1;
      lVar15 = lVar15 + 0xe;
    } while ((int)uVar13 != lVar11);
  }
  DVar4 = cuddNextLow(table,y);
  pMVar12 = (Move *)0x0;
  if ((xLow <= (int)DVar4) && (local_58 <= iVar14)) {
    pDVar9 = (DdNode *)0x0;
    while( true ) {
      pDVar2 = table->subtables;
      x = pDVar2[(int)DVar4].next;
      iVar5 = cuddSymmCheck(table,DVar4,y);
      if (iVar5 == 0) break;
      pDVar2[(int)DVar4].next = y;
      DVar4 = pDVar2[y].next;
      do {
        DVar6 = DVar4;
        DVar4 = pDVar2[(int)DVar6].next;
      } while (pDVar2[(int)DVar6].next != y);
      pDVar2[(int)DVar6].next = x;
      pDVar8 = pDVar9;
LAB_00924f24:
      DVar4 = cuddNextLow(table,x);
      if ((int)DVar4 < xLow) {
        return (Move *)pDVar8;
      }
      pDVar9 = pDVar8;
      y = x;
      if (iVar14 < local_58) {
        return (Move *)pDVar8;
      }
    }
    if ((x == DVar4) && (pDVar2[y].next == y)) {
      iVar5 = table->invperm[(int)DVar4];
      local_34 = cuddSwapInPlace(table,DVar4,y);
      if (local_34 != 0) {
        iVar3 = cuddTestInteract(table,iVar5,y_00);
        if (iVar3 != 0) {
          local_58 = (local_58 - (uint)(table->vars[iVar5]->ref == 1)) + table->subtables[y].keys;
        }
        pDVar8 = cuddDynamicAllocNode(table);
        if (pDVar8 != (DdNode *)0x0) {
          pDVar8->index = DVar4;
          pDVar8->ref = y;
          *(int *)((long)&pDVar8->next + 4) = local_34;
          (pDVar8->type).kids.T = pDVar9;
          if ((double)iVar14 * table->maxGrowth < (double)local_34) {
            return (Move *)pDVar8;
          }
          local_40 = pDVar8;
          if (local_34 < iVar14) {
            iVar14 = local_34;
          }
          goto LAB_00924f24;
        }
      }
    }
    else {
      iVar5 = ddSymmGroupMove(table,DVar4,y,(Move **)&local_40);
      pDVar8 = local_40;
      pDVar9 = local_40;
      if (iVar5 != 0) {
        DVar4 = local_40->ref;
        do {
          iVar3 = table->invperm[(int)DVar4];
          iVar7 = cuddTestInteract(table,iVar3,y_00);
          if (iVar7 != 0) {
            local_58 = (local_58 - (uint)(table->vars[iVar3]->ref == 1)) +
                       table->subtables[(int)DVar4].keys;
          }
          DVar4 = table->subtables[(int)DVar4].next;
        } while (DVar4 != pDVar8->ref);
        if ((double)iVar14 * table->maxGrowth < (double)iVar5) {
          return (Move *)pDVar8;
        }
        if (iVar5 < iVar14) {
          iVar14 = iVar5;
        }
        goto LAB_00924f24;
      }
    }
    pMVar12 = (Move *)0x1;
    if (pDVar9 != (DdNode *)0x0) {
      pDVar8 = table->nextFree;
      do {
        pDVar10 = pDVar9;
        pDVar9 = (pDVar10->type).kids.T;
        pDVar10->ref = 0;
        pDVar10->next = pDVar8;
        pDVar8 = pDVar10;
      } while (pDVar9 != (DdNode *)0x0);
      table->nextFree = pDVar10;
    }
  }
  return pMVar12;
}

Assistant:

static Move *
ddSymmSiftingUp(
  DdManager * table,
  int  y,
  int  xLow)
{
    Move *moves;
    Move *move;
    int  x;
    int  size;
    int  i;
    int  gxtop,gybot;
    int  limitSize;
    int  xindex, yindex;
    int  zindex;
    int  z;
    int  isolated;
    int  L;     /* lower bound on DD size */
#ifdef DD_DEBUG
    int  checkL;
#endif


    moves = NULL;
    yindex = table->invperm[y];

    /* Initialize the lower bound.
    ** The part of the DD below the bottom of y' group will not change.
    ** The part of the DD above y that does not interact with y will not
    ** change. The rest may vanish in the best case, except for
    ** the nodes at level xLow, which will not vanish, regardless.
    */
    limitSize = L = table->keys - table->isolated;
    gybot = y;
    while ((unsigned) gybot < table->subtables[gybot].next)
        gybot = table->subtables[gybot].next;
    for (z = xLow + 1; z <= gybot; z++) {
        zindex = table->invperm[z];
        if (zindex == yindex || cuddTestInteract(table,zindex,yindex)) {
            isolated = table->vars[zindex]->ref == 1;
            L -= table->subtables[z].keys - isolated;
        }
    }

    x = cuddNextLow(table,y);
    while (x >= xLow && L <= limitSize) {
#ifdef DD_DEBUG
        gybot = y;
        while ((unsigned) gybot < table->subtables[gybot].next)
            gybot = table->subtables[gybot].next;
        checkL = table->keys - table->isolated;
        for (z = xLow + 1; z <= gybot; z++) {
            zindex = table->invperm[z];
            if (zindex == yindex || cuddTestInteract(table,zindex,yindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkL -= table->subtables[z].keys - isolated;
            }
        }
        assert(L == checkL);
#endif
        gxtop = table->subtables[x].next;
        if (cuddSymmCheck(table,x,y)) {
            /* Symmetry found, attach symm groups */
            table->subtables[x].next = y;
            i = table->subtables[y].next;
            while (table->subtables[i].next != (unsigned) y)
                i = table->subtables[i].next;
            table->subtables[i].next = gxtop;
        } else if (table->subtables[x].next == (unsigned) x &&
                   table->subtables[y].next == (unsigned) y) {
            /* x and y have self symmetry */
            xindex = table->invperm[x];
            size = cuddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtables[x].next == (unsigned) x);
            assert(table->subtables[y].next == (unsigned) y);
#endif
            if (size == 0) goto ddSymmSiftingUpOutOfMem;
            /* Update the lower bound. */
            if (cuddTestInteract(table,xindex,yindex)) {
                isolated = table->vars[xindex]->ref == 1;
                L += table->subtables[y].keys - isolated;
            }
            move = (Move *) cuddDynamicAllocNode(table);
            if (move == NULL) goto ddSymmSiftingUpOutOfMem;
            move->x = x;
            move->y = y;
            move->size = size;
            move->next = moves;
            moves = move;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(moves);
            if (size < limitSize) limitSize = size;
        } else { /* Group move */
            size = ddSymmGroupMove(table,x,y,&moves);
            if (size == 0) goto ddSymmSiftingUpOutOfMem;
            /* Update the lower bound. */
            z = moves->y;
            do {
                zindex = table->invperm[z];
                if (cuddTestInteract(table,zindex,yindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    L += table->subtables[z].keys - isolated;
                }
                z = table->subtables[z].next;
            } while (z != (int) moves->y);
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(moves);
            if (size < limitSize) limitSize = size;
        }
        y = gxtop;
        x = cuddNextLow(table,y);
    }

    return(moves);

ddSymmSiftingUpOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(MV_OOM);

}